

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int sqlite3BtreeBeginTrans(Btree *p,int wrflag,int *pSchemaVersion)

{
  int *piVar1;
  ushort uVar2;
  undefined2 uVar3;
  uint uVar4;
  u32 uVar5;
  Pgno PVar6;
  BtShared *pBVar7;
  Pager *pPVar8;
  Wal *pWVar9;
  MemPage *pMVar10;
  sqlite3 *psVar11;
  _func_int_void_ptr_int *p_Var12;
  uint uVar13;
  char cVar14;
  byte bVar15;
  int iVar16;
  uint uVar17;
  uint uVar18;
  uint uVar19;
  int iVar20;
  BtLock *pBVar21;
  uint uVar22;
  u16 uVar23;
  Btree *pBVar24;
  u8 *puVar25;
  uint uVar26;
  long in_FS_OFFSET;
  bool bVar27;
  undefined1 auVar28 [16];
  int iStack_44;
  MemPage *pMStack_40;
  long lStack_38;
  
  if (((p->sharable == '\0') && (p->inTrans != '\0')) && (wrflag == 0 || p->inTrans != '\x01')) {
    pBVar7 = p->pBt;
    if (pSchemaVersion != (int *)0x0) {
      uVar17 = *(uint *)(pBVar7->pPage1->aData + 0x28);
      *pSchemaVersion =
           uVar17 >> 0x18 | (uVar17 & 0xff0000) >> 8 | (uVar17 & 0xff00) << 8 | uVar17 << 0x18;
    }
    if (wrflag != 0) {
      pPVar8 = pBVar7->pPager;
      iVar16 = p->db->nSavepoint;
      if ((pPVar8->nSavepoint < iVar16) && (pPVar8->useJournal != '\0')) {
        iVar16 = pagerOpenSavepoint(pPVar8,iVar16);
        return iVar16;
      }
    }
    return 0;
  }
  lStack_38 = *(long *)(in_FS_OFFSET + 0x28);
  pBVar7 = p->pBt;
  pPVar8 = pBVar7->pPager;
  if ((p->sharable != '\0') && (p->wantToLock = p->wantToLock + 1, p->locked == '\0')) {
    btreeLockCarefully(p);
  }
  uVar17 = 0;
  if ((p->inTrans == '\x02') || (uVar17 = 0, wrflag == 0 && p->inTrans == '\x01'))
  goto LAB_0013ea4e;
  if (((p->db->flags & 0x2000000) != 0) && (pPVar8->readOnly == '\0')) {
    *(byte *)&pBVar7->btsFlags = (byte)pBVar7->btsFlags & 0xfe;
  }
  if ((wrflag != 0) && (uVar17 = 8, (pBVar7->btsFlags & 1) != 0)) goto LAB_0013ea4e;
  cVar14 = (char)pBVar7->btsFlags;
  if (wrflag == 0) {
    if (-1 < cVar14) goto LAB_0013e309;
LAB_0013e32c:
    pBVar24 = pBVar7->pWriter;
LAB_0013e334:
    bVar27 = pBVar24->db == (sqlite3 *)0x0;
  }
  else {
    if ((cVar14 < '\0') || (pBVar7->inTransaction == '\x02')) goto LAB_0013e32c;
LAB_0013e309:
    bVar27 = true;
    if (1 < wrflag) {
      for (pBVar21 = pBVar7->pLock; pBVar21 != (BtLock *)0x0; pBVar21 = pBVar21->pNext) {
        pBVar24 = pBVar21->pBtree;
        if (pBVar24 != p) goto LAB_0013e334;
      }
    }
  }
  uVar17 = 0x106;
  if ((bVar27) && (uVar17 = querySharedCacheTableLock(p,1,'\x01'), uVar17 == 0)) {
    uVar2 = pBVar7->btsFlags;
    pBVar7->btsFlags = uVar2 & 0xffef;
    if (pBVar7->nPage == 0) {
      pBVar7->btsFlags = uVar2 | 0x10;
    }
    uVar17 = 0;
    do {
      if (pBVar7->pPage1 == (MemPage *)0x0) {
        do {
          pMStack_40 = (MemPage *)&DAT_aaaaaaaaaaaaaaaa;
          uVar19 = sqlite3PagerSharedLock(pBVar7->pPager);
          if ((uVar19 == 0) &&
             (uVar19 = btreeGetPage(pBVar7,1,&pMStack_40,0), pMVar10 = pMStack_40, uVar19 == 0)) {
            puVar25 = pMStack_40->aData;
            uVar19 = *(uint *)(puVar25 + 0x1c);
            uVar26 = uVar19 >> 0x18 | (uVar19 & 0xff0000) >> 8 | (uVar19 & 0xff00) << 8 |
                     uVar19 << 0x18;
            uVar4 = pBVar7->pPager->dbSize;
            if ((uVar26 == 0) || (*(int *)(puVar25 + 0x18) != *(int *)(puVar25 + 0x5c))) {
              uVar26 = uVar4;
            }
            uVar18 = 0;
            if (((pBVar7->db->flags & 0x2000000) == 0) && (uVar26 != 0)) {
              auVar28[0] = -(*puVar25 == 'S');
              auVar28[1] = -(puVar25[1] == 'Q');
              auVar28[2] = -(puVar25[2] == 'L');
              auVar28[3] = -(puVar25[3] == 'i');
              auVar28[4] = -(puVar25[4] == 't');
              auVar28[5] = -(puVar25[5] == 'e');
              auVar28[6] = -(puVar25[6] == ' ');
              auVar28[7] = -(puVar25[7] == 'f');
              auVar28[8] = -(puVar25[8] == 'o');
              auVar28[9] = -(puVar25[9] == 'r');
              auVar28[10] = -(puVar25[10] == 'm');
              auVar28[0xb] = -(puVar25[0xb] == 'a');
              auVar28[0xc] = -(puVar25[0xc] == 't');
              auVar28[0xd] = -(puVar25[0xd] == ' ');
              auVar28[0xe] = -(puVar25[0xe] == '3');
              auVar28[0xf] = -(puVar25[0xf] == '\0');
              iVar16 = 2;
              uVar19 = 0x1a;
              if ((ushort)((ushort)(SUB161(auVar28 >> 7,0) & 1) |
                           (ushort)(SUB161(auVar28 >> 0xf,0) & 1) << 1 |
                           (ushort)(SUB161(auVar28 >> 0x17,0) & 1) << 2 |
                           (ushort)(SUB161(auVar28 >> 0x1f,0) & 1) << 3 |
                           (ushort)(SUB161(auVar28 >> 0x27,0) & 1) << 4 |
                           (ushort)(SUB161(auVar28 >> 0x2f,0) & 1) << 5 |
                           (ushort)(SUB161(auVar28 >> 0x37,0) & 1) << 6 |
                           (ushort)(SUB161(auVar28 >> 0x3f,0) & 1) << 7 |
                           (ushort)(SUB161(auVar28 >> 0x47,0) & 1) << 8 |
                           (ushort)(SUB161(auVar28 >> 0x4f,0) & 1) << 9 |
                           (ushort)(SUB161(auVar28 >> 0x57,0) & 1) << 10 |
                           (ushort)(SUB161(auVar28 >> 0x5f,0) & 1) << 0xb |
                           (ushort)(SUB161(auVar28 >> 0x67,0) & 1) << 0xc |
                           (ushort)(SUB161(auVar28 >> 0x6f,0) & 1) << 0xd |
                           (ushort)(SUB161(auVar28 >> 0x77,0) & 1) << 0xe |
                          (ushort)(auVar28[0xf] >> 7) << 0xf) == 0xffff) {
                if (2 < puVar25[0x12]) {
                  *(byte *)&pBVar7->btsFlags = (byte)pBVar7->btsFlags | 1;
                }
                if (puVar25[0x13] < 3) {
                  uVar19 = 0x1a;
                  if ((puVar25[0x13] == 2) && ((pBVar7->btsFlags & 0x20) == 0)) {
                    iStack_44 = 0;
                    uVar19 = sqlite3PagerOpenWal(pBVar7->pPager,&iStack_44);
                    uVar17 = 0;
                    if (uVar19 == 0) {
                      if (iStack_44 == 0) {
                        releasePageOne(pMVar10);
                        iVar16 = 1;
                        uVar19 = 0;
                        bVar27 = false;
                      }
                      else {
                        iVar16 = 0;
                        bVar27 = true;
                        uVar19 = 0x1a;
                      }
                    }
                    else {
                      iVar16 = 2;
                      bVar27 = false;
                    }
                    if (!bVar27) goto LAB_0013e433;
                  }
                  iVar16 = 2;
                  uVar17 = 0;
                  if (puVar25[0x17] == ' ' && *(short *)(puVar25 + 0x15) == 0x2040) {
                    uVar13 = (uint)puVar25[0x10] * 0x100;
                    uVar18 = (uint)puVar25[0x11] * 0x10000;
                    if ((0xffff00ff < (uVar18 + uVar13) - 0x10001) &&
                       (uVar22 = uVar18 | uVar13, uVar17 = 0, ((uVar13 + uVar18) - 1 & uVar22) == 0)
                       ) {
                      bVar15 = puVar25[0x14];
                      uVar17 = uVar22 - bVar15;
                      if (uVar22 == pBVar7->pageSize) {
                        uVar18 = uVar26;
                        if ((uVar4 < uVar26) &&
                           (uVar18 = uVar4, (pBVar7->db->flags & 0x10000001) != 1)) {
                          sqlite3_log(0xb,"%s at line %d of [%.10s]","database corruption",0x121bd,
                                      "873d4e274b4988d260ba8354a9718324a1c26187a4ab4c1cc0227c03d0f10e70"
                                     );
                          uVar19 = 0xb;
                        }
                        else {
                          uVar26 = uVar18;
                          if (0x1df < uVar17) {
                            *(byte *)&pBVar7->btsFlags = (byte)pBVar7->btsFlags | 2;
                            pBVar7->pageSize = uVar22;
                            pBVar7->usableSize = uVar17;
                            uVar17 = *(uint *)(puVar25 + 0x34);
                            pBVar7->autoVacuum =
                                 ((uVar17 >> 0x18 != 0 || (uVar17 & 0xff0000) != 0) ||
                                 (uVar17 & 0xff00) != 0) || (uVar17 & 0xff) != 0;
                            uVar17 = *(uint *)(puVar25 + 0x40);
                            pBVar7->incrVacuum =
                                 ((uVar17 >> 0x18 != 0 || (uVar17 & 0xff0000) != 0) ||
                                 (uVar17 & 0xff00) != 0) || (uVar17 & 0xff) != 0;
                            iVar16 = 0;
                            uVar17 = 0;
                            goto LAB_0013e433;
                          }
                        }
                        uVar17 = 0;
                        iVar16 = 2;
                      }
                      else {
                        releasePageOne(pMVar10);
                        pBVar7->usableSize = uVar17;
                        pBVar7->pageSize = uVar22;
                        *(byte *)&pBVar7->btsFlags = (byte)pBVar7->btsFlags | 2;
                        if (pBVar7->pTmpSpace != (u8 *)0x0) {
                          puVar25 = pBVar7->pTmpSpace + -4;
                          pBVar7->pTmpSpace = puVar25;
                          pcache1Free(puVar25);
                          pBVar7->pTmpSpace = (u8 *)0x0;
                        }
                        uVar17 = sqlite3PagerSetPagesize
                                           (pBVar7->pPager,&pBVar7->pageSize,(uint)bVar15);
                        iVar16 = 1;
                        uVar19 = uVar17;
                      }
                    }
                  }
                }
              }
LAB_0013e433:
              if (iVar16 == 2) {
                releasePageOne(pMVar10);
                pBVar7->pPage1 = (MemPage *)0x0;
              }
              else {
                uVar19 = uVar17;
                uVar18 = uVar26;
                if (iVar16 == 0) goto LAB_0013e447;
              }
            }
            else {
LAB_0013e447:
              uVar5 = pBVar7->usableSize;
              uVar17 = (uVar5 * 0x40 - 0x300) / 0xff - 0x17;
              pBVar7->maxLocal = (u16)uVar17;
              uVar23 = (short)((uVar5 * 0x20 - 0x180) / 0xff) - 0x17;
              pBVar7->minLocal = uVar23;
              pBVar7->maxLeaf = (short)uVar5 - 0x23;
              pBVar7->minLeaf = uVar23;
              if ((uVar17 & 0xffff) < 0x80) {
                pBVar7->max1bytePayload = (u8)uVar17;
              }
              else {
                pBVar7->max1bytePayload = '\x7f';
              }
              pBVar7->pPage1 = pMVar10;
              pBVar7->nPage = uVar18;
              uVar19 = 0;
            }
          }
          uVar17 = uVar19;
          if (uVar17 != 0) goto LAB_0013e735;
        } while (pBVar7->pPage1 == (MemPage *)0x0);
        uVar17 = 0;
      }
LAB_0013e735:
      if (((wrflag != 0) && (uVar17 == 0)) && (uVar17 = 8, (pBVar7->btsFlags & 1) == 0)) {
        uVar17 = pPVar8->errCode;
        if (uVar17 == 0) {
          pPVar8->subjInMemory = p->db->temp_store == '\x02';
          uVar17 = 0;
          if (pPVar8->eState == '\x01') {
            if (pPVar8->pWal == (Wal *)0x0) {
              uVar17 = pagerLockDb(pPVar8,2);
              if (uVar17 == 0 && 1 < wrflag) {
                do {
                  uVar17 = pagerLockDb(pPVar8,4);
                  if (uVar17 != 5) break;
                  iVar16 = (*pPVar8->xBusyHandler)(pPVar8->pBusyHandlerArg);
                } while (iVar16 != 0);
              }
            }
            else {
              if ((pPVar8->exclusiveMode != '\0') && (pPVar8->pWal->exclusiveMode == '\0')) {
                uVar17 = pagerLockDb(pPVar8,4);
                if (uVar17 != 0) goto LAB_0013e8c8;
                pWVar9 = pPVar8->pWal;
                if (pWVar9->exclusiveMode == '\0') {
                  (*pWVar9->pDbFd->pMethods->xShmLock)(pWVar9->pDbFd,pWVar9->readLock + 3,1,5);
                }
                pWVar9->exclusiveMode = '\x01';
              }
              pWVar9 = pPVar8->pWal;
              uVar17 = 8;
              if (pWVar9->readOnly == '\0') {
                uVar17 = 0;
                if (pWVar9->exclusiveMode == '\0') {
                  uVar17 = (*pWVar9->pDbFd->pMethods->xShmLock)(pWVar9->pDbFd,0,1,10);
                }
                if (uVar17 == 0) {
                  pWVar9->writeLock = '\x01';
                  uVar17 = bcmp(&pWVar9->hdr,*pWVar9->apWiData,0x30);
                  if (uVar17 != 0) {
                    uVar17 = 0x205;
                    if (pWVar9->exclusiveMode == '\0') {
                      (*pWVar9->pDbFd->pMethods->xShmLock)(pWVar9->pDbFd,0,1,9);
                    }
                    pWVar9->writeLock = '\0';
                  }
                }
              }
            }
            if (uVar17 == 0) {
              pPVar8->eState = '\x02';
              PVar6 = pPVar8->dbSize;
              pPVar8->dbHintSize = PVar6;
              pPVar8->dbFileSize = PVar6;
              pPVar8->dbOrigSize = PVar6;
              pPVar8->journalOff = 0;
              uVar17 = 0;
            }
          }
        }
LAB_0013e8c8:
        if (uVar17 == 0x205) {
          uVar17 = (uint)(pBVar7->inTransaction != '\0') << 9 | 5;
        }
        else if (uVar17 == 0) {
          uVar17 = newDatabase(pBVar7);
        }
      }
      if (((uVar17 != 0) && (pBVar7->inTransaction == '\0')) &&
         (pMVar10 = pBVar7->pPage1, pMVar10 != (MemPage *)0x0)) {
        pBVar7->pPage1 = (MemPage *)0x0;
        releasePageOne(pMVar10);
      }
      if (((char)uVar17 != '\x05') || (pBVar7->inTransaction != '\0')) goto LAB_0013e9b6;
      psVar11 = pBVar7->db;
      p_Var12 = (psVar11->busyHandler).xBusyHandler;
      if ((p_Var12 == (_func_int_void_ptr_int *)0x0) ||
         (iVar16 = (psVar11->busyHandler).nBusy, iVar16 < 0)) goto LAB_0013e9b6;
      iVar16 = (*p_Var12)((psVar11->busyHandler).pBusyArg,iVar16);
      if (iVar16 == 0) {
        iVar20 = -1;
      }
      else {
        iVar20 = (psVar11->busyHandler).nBusy + 1;
      }
      (psVar11->busyHandler).nBusy = iVar20;
      if (iVar16 == 0) goto LAB_0013e9b6;
    } while( true );
  }
LAB_0013ea4e:
  if (uVar17 == 0) {
    if (pSchemaVersion != (int *)0x0) {
      uVar17 = *(uint *)(pBVar7->pPage1->aData + 0x28);
      *pSchemaVersion =
           uVar17 >> 0x18 | (uVar17 & 0xff0000) >> 8 | (uVar17 & 0xff00) << 8 | uVar17 << 0x18;
    }
    uVar17 = 0;
    if (((wrflag != 0) && (iVar16 = p->db->nSavepoint, pPVar8->nSavepoint < iVar16)) &&
       (uVar17 = 0, pPVar8->useJournal != '\0')) {
      uVar17 = pagerOpenSavepoint(pPVar8,iVar16);
    }
  }
  if (p->sharable != '\0') {
    piVar1 = &p->wantToLock;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      unlockBtreeMutex(p);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lStack_38) {
    __stack_chk_fail();
  }
  return uVar17;
LAB_0013e9b6:
  if (uVar17 == 0) {
    if ((p->inTrans == '\0') &&
       (pBVar7->nTransaction = pBVar7->nTransaction + 1, p->sharable != '\0')) {
      (p->lock).eLock = '\x01';
      (p->lock).pNext = pBVar7->pLock;
      pBVar7->pLock = &p->lock;
    }
    bVar15 = 2 - (wrflag == 0);
    p->inTrans = bVar15;
    if (pBVar7->inTransaction < bVar15) {
      pBVar7->inTransaction = bVar15;
    }
    uVar17 = 0;
    if (wrflag != 0) {
      pMVar10 = pBVar7->pPage1;
      pBVar7->pWriter = p;
      uVar3 = pBVar7->btsFlags;
      pBVar7->btsFlags = (ushort)(1 < wrflag) << 6 | uVar3 & 0xffbf;
      uVar19 = *(uint *)(pMVar10->aData + 0x1c);
      if ((pBVar7->nPage !=
           (uVar19 >> 0x18 | (uVar19 & 0xff0000) >> 8 | (uVar19 & 0xff00) << 8 | uVar19 << 0x18)) &&
         (uVar17 = sqlite3PagerWrite(pMVar10->pDbPage), uVar17 == 0)) {
        uVar17 = pBVar7->nPage;
        *(uint *)(pMVar10->aData + 0x1c) =
             uVar17 >> 0x18 | (uVar17 & 0xff0000) >> 8 | (uVar17 & 0xff00) << 8 | uVar17 << 0x18;
        uVar17 = 0;
      }
    }
  }
  goto LAB_0013ea4e;
}

Assistant:

SQLITE_PRIVATE int sqlite3BtreeBeginTrans(Btree *p, int wrflag, int *pSchemaVersion){
  BtShared *pBt;
  if( p->sharable
   || p->inTrans==TRANS_NONE
   || (p->inTrans==TRANS_READ && wrflag!=0)
  ){
    return btreeBeginTrans(p,wrflag,pSchemaVersion);
  }
  pBt = p->pBt;
  if( pSchemaVersion ){
    *pSchemaVersion = get4byte(&pBt->pPage1->aData[40]);
  }
  if( wrflag ){
    /* This call makes sure that the pager has the correct number of
    ** open savepoints. If the second parameter is greater than 0 and
    ** the sub-journal is not already open, then it will be opened here.
    */
    return sqlite3PagerOpenSavepoint(pBt->pPager, p->db->nSavepoint);
  }else{
    return SQLITE_OK;
  }
}